

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Document::ReadPropertyTemplates(Document *this)

{
  string *__k;
  Scope *pSVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *p_Var2;
  pointer ppTVar3;
  Element *pEVar4;
  __shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  _Rb_tree_node_base *p_Var5;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  pVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  shared_ptr<const_Assimp::FBX::PropertyTable> props;
  string sStack_d8;
  Document *local_b8;
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  undefined1 local_a0 [16];
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar1 = (this->parser->root)._M_t.
           super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
           super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  local_b8 = this;
  std::__cxx11::string::string((string *)&sStack_d8,"Definitions",(allocator *)(local_a0 + 0x10));
  pEVar4 = Scope::operator[](pSVar1,&sStack_d8);
  std::__cxx11::string::~string((string *)&sStack_d8);
  if ((pEVar4 == (Element *)0x0) ||
     (p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                *)(pEVar4->compound)._M_t.
                  super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
                  .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl,
     p_Var2 == (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                *)0x0)) {
    std::__cxx11::string::string
              ((string *)&sStack_d8,"no Definitions dictionary found",(allocator *)(local_a0 + 0x10)
              );
    Util::DOMWarning(&sStack_d8,(Element *)0x0);
    std::__cxx11::string::~string((string *)&sStack_d8);
  }
  else {
    std::__cxx11::string::string((string *)&sStack_d8,"ObjectType",(allocator *)(local_a0 + 0x10));
    pVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
            ::equal_range(p_Var2,&sStack_d8);
    local_b0 = (_Base_ptr)pVar6.second._M_node;
    std::__cxx11::string::~string((string *)&sStack_d8);
    auVar8._8_8_ = extraout_RDX;
    auVar8._0_8_ = pVar6.first._M_node._M_node;
    local_b8 = (Document *)&local_b8->templates;
    __k = (string *)(local_a0 + 0x10);
    while( true ) {
      local_a8 = auVar8._0_8_;
      if (local_a8 == local_b0) break;
      pEVar4 = *(Element **)(local_a8 + 2);
      p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                *)(pEVar4->compound)._M_t.
                  super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
                  .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
      if (p_Var2 == (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                     *)0x0) {
        std::__cxx11::string::string
                  ((string *)&sStack_d8,"expected nested scope in ObjectType, ignoring",
                   (allocator *)__k);
        Util::DOMWarning(&sStack_d8,pEVar4);
      }
      else {
        ppTVar3 = (pEVar4->tokens).
                  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (ppTVar3 ==
            (pEVar4->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string
                    ((string *)&sStack_d8,"expected name for ObjectType element, ignoring",
                     (allocator *)__k);
          Util::DOMWarning(&sStack_d8,pEVar4);
        }
        else {
          ParseTokenAsString_abi_cxx11_(&sStack_d8,(FBX *)*ppTVar3,auVar8._8_8_);
          std::__cxx11::string::string((string *)__k,"PropertyTemplate",(allocator *)&local_70);
          pVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                  ::equal_range(p_Var2,__k);
          std::__cxx11::string::~string((string *)__k);
          auVar7._8_8_ = extraout_RDX_00;
          auVar7._0_8_ = pVar6.first._M_node._M_node;
          while( true ) {
            p_Var5 = auVar7._0_8_;
            if (p_Var5 == pVar6.second._M_node._M_node) break;
            pEVar4 = *(Element **)(p_Var5 + 2);
            pSVar1 = (pEVar4->compound)._M_t.
                     super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
                     .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
            if (pSVar1 == (Scope *)0x0) {
              std::__cxx11::string::string
                        ((string *)__k,"expected nested scope in PropertyTemplate, ignoring",
                         (allocator *)&local_70);
              Util::DOMWarning(__k,pEVar4);
            }
            else {
              ppTVar3 = (pEVar4->tokens).
                        super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (ppTVar3 ==
                  (pEVar4->tokens).
                  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::__cxx11::string::string
                          ((string *)__k,"expected name for PropertyTemplate element, ignoring",
                           (allocator *)&local_70);
                Util::DOMWarning(__k,pEVar4);
              }
              else {
                ParseTokenAsString_abi_cxx11_(__k,(FBX *)*ppTVar3,auVar7._8_8_);
                std::__cxx11::string::string
                          ((string *)&local_70,"Properties70",(allocator *)&local_50);
                pEVar4 = Scope::operator[](pSVar1,&local_70);
                std::__cxx11::string::~string((string *)&local_70);
                if (pEVar4 != (Element *)0x0) {
                  std::__shared_ptr<Assimp::FBX::PropertyTable_const,(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr<Assimp::FBX::PropertyTable_const,void>
                            ((__shared_ptr<Assimp::FBX::PropertyTable_const,(__gnu_cxx::_Lock_policy)2>
                              *)&local_70,(PropertyTable *)0x0);
                  std::
                  make_shared<Assimp::FBX::PropertyTable_const,Assimp::FBX::Element_const&,std::shared_ptr<Assimp::FBX::PropertyTable_const>>
                            ((Element *)local_a0,
                             (shared_ptr<const_Assimp::FBX::PropertyTable> *)pEVar4);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &local_70._M_string_length);
                  std::operator+(&local_50,&sStack_d8,".");
                  std::operator+(&local_70,&local_50,__k);
                  this_00 = &std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_Assimp::FBX::PropertyTable>_>_>_>
                                           *)local_b8,&local_70)->
                             super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>
                  ;
                  std::__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>::
                  operator=(this_00,(__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>
                                     *)local_a0);
                  std::__cxx11::string::~string((string *)&local_70);
                  std::__cxx11::string::~string((string *)&local_50);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
                }
              }
            }
            std::__cxx11::string::~string((string *)__k);
            auVar7 = std::_Rb_tree_increment(p_Var5);
          }
        }
      }
      std::__cxx11::string::~string((string *)&sStack_d8);
      auVar8 = std::_Rb_tree_increment(local_a8);
    }
  }
  return;
}

Assistant:

void Document::ReadPropertyTemplates()
{
    const Scope& sc = parser.GetRootScope();
    // read property templates from "Definitions" section
    const Element* const edefs = sc["Definitions"];
    if(!edefs || !edefs->Compound()) {
        DOMWarning("no Definitions dictionary found");
        return;
    }

    const Scope& sdefs = *edefs->Compound();
    const ElementCollection otypes = sdefs.GetCollection("ObjectType");
    for(ElementMap::const_iterator it = otypes.first; it != otypes.second; ++it) {
        const Element& el = *(*it).second;
        const Scope* sc = el.Compound();
        if(!sc) {
            DOMWarning("expected nested scope in ObjectType, ignoring",&el);
            continue;
        }

        const TokenList& tok = el.Tokens();
        if(tok.empty()) {
            DOMWarning("expected name for ObjectType element, ignoring",&el);
            continue;
        }

        const std::string& oname = ParseTokenAsString(*tok[0]);

        const ElementCollection templs = sc->GetCollection("PropertyTemplate");
        for(ElementMap::const_iterator it = templs.first; it != templs.second; ++it) {
            const Element& el = *(*it).second;
            const Scope* sc = el.Compound();
            if(!sc) {
                DOMWarning("expected nested scope in PropertyTemplate, ignoring",&el);
                continue;
            }

            const TokenList& tok = el.Tokens();
            if(tok.empty()) {
                DOMWarning("expected name for PropertyTemplate element, ignoring",&el);
                continue;
            }

            const std::string& pname = ParseTokenAsString(*tok[0]);

            const Element* Properties70 = (*sc)["Properties70"];
            if(Properties70) {
                std::shared_ptr<const PropertyTable> props = std::make_shared<const PropertyTable>(
                    *Properties70,std::shared_ptr<const PropertyTable>(static_cast<const PropertyTable*>(NULL))
                );

                templates[oname+"."+pname] = props;
            }
        }
    }
}